

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  IRIns *pIVar5;
  ushort uVar6;
  AliasRet AVar7;
  int iVar8;
  uint uVar9;
  TRef TVar10;
  ulong uVar11;
  IRIns *pIVar12;
  ulong uVar13;
  cTValue *pcVar14;
  IRIns *pIVar15;
  uint uVar16;
  TValue keyv;
  TValue local_38;
  
  pIVar5 = (J->cur).ir;
  pIVar15 = pIVar5 + xref;
  uVar11 = (ulong)(J->fold).ins.field_1.o;
  uVar3 = J->chain[uVar11 + 7];
  while (xref < uVar3) {
    uVar13 = (ulong)uVar3;
    AVar7 = aa_ahref(J,pIVar15,pIVar5 + pIVar5[uVar13].field_0.op1);
    uVar16 = (uint)uVar3;
    if (AVar7 == ALIAS_MAY) goto LAB_00132981;
    if (AVar7 == ALIAS_MUST) {
      return (uint)*(ushort *)((long)pIVar5 + uVar13 * 8 + 2);
    }
    uVar3 = *(ushort *)((long)pIVar5 + uVar13 * 8 + 6);
  }
  bVar1 = (pIVar15->field_1).o;
  pIVar12 = pIVar15;
  if ((bVar1 & 0xfe) == 0x38) {
    pIVar12 = pIVar5 + (pIVar15->field_0).op1;
  }
  uVar4 = (pIVar12->field_0).op1;
  cVar2 = *(char *)((long)pIVar5 + (ulong)uVar4 * 8 + 5);
  uVar16 = xref;
  if (((cVar2 == 'O') || ((cVar2 == 'P' && (-1 < (short)(pIVar15->field_0).op2)))) &&
     (iVar8 = fwd_aa_tab_clear(J,(uint)uVar4,(uint)uVar4), iVar8 != 0)) {
    if (bVar1 == 0x38) {
      for (uVar6 = J->chain[0x3b]; uVar4 < uVar6;
          uVar6 = *(ushort *)((long)pIVar5 + (ulong)uVar6 * 8 + 6)) {
        if ((*(byte *)((long)pIVar5 +
                      (ulong)*(ushort *)((long)pIVar5 + (ulong)uVar6 * 8 + 2) * 8 + 4) & 0x1f) ==
            0xe) goto LAB_00132981;
      }
    }
    else {
      uVar13 = (ulong)(pIVar15->field_0).op2;
      if (*(char *)((long)pIVar5 + uVar13 * 8 + 5) == '\x1e') {
        uVar13 = (ulong)pIVar5[uVar13].field_0.op1;
      }
      if (((*(byte *)((long)pIVar5 + uVar13 * 8 + 4) & 0x1f) == 0xe) && (uVar4 < J->chain[0x3b]))
      goto LAB_00132981;
    }
    while (uVar4 < uVar3) {
      uVar13 = (ulong)uVar3;
      AVar7 = aa_ahref(J,pIVar15,pIVar5 + pIVar5[uVar13].field_0.op1);
      if (AVar7 == ALIAS_MAY) goto LAB_00132981;
      if (AVar7 == ALIAS_MUST) {
        return (uint)*(ushort *)((long)pIVar5 + uVar13 * 8 + 2);
      }
      uVar3 = *(ushort *)((long)pIVar5 + uVar13 * 8 + 6);
    }
    if (cVar2 == 'O') {
      return 0x7fff;
    }
    pIVar15 = pIVar5 + (pIVar15->field_0).op2;
    if ((pIVar15->field_1).o == '\x1e') {
      pIVar15 = pIVar5 + (pIVar15->field_0).op1;
    }
    lj_ir_kvalue(J->L,&local_38,pIVar15);
    pcVar14 = lj_tab_get(J->L,(GCtab *)(ulong)(J->cur).ir[pIVar5[uVar4].field_0.op1].field_1.op12,
                         &local_38);
    uVar9 = (pcVar14->field_2).it;
    if (0xfffffffc < uVar9) {
      return ~uVar9 * 0xffffff + 0x7fff;
    }
    if (uVar9 < 0xfffeffff) {
      TVar10 = lj_ir_knum_u64(J,pcVar14->u64);
      return TVar10;
    }
    if (uVar9 + 0xd < 9) {
      TVar10 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar14->u32).lo,IRT_STR);
      return TVar10;
    }
    uVar11 = (ulong)(J->fold).ins.field_1.o;
  }
LAB_00132981:
  uVar9 = (uint)J->chain[uVar11];
  if (uVar16 < J->chain[uVar11]) {
    pIVar15 = (J->cur).ir;
    do {
      if (pIVar15[uVar9].field_0.op1 == xref) {
        return uVar9;
      }
      uVar9 = (uint)*(ushort *)((long)pIVar15 + (ulong)uVar9 * 8 + 6);
    } while (uVar16 < uVar9);
  }
  return 0;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if ((ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) &&
	fwd_aa_tab_clear(J, tab, tab)) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** Or a NEWREF may rehash the table and move unrelated number keys.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      } else {
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	if (irt_isnum(key->t) && J->chain[IR_NEWREF] > tab)
	  goto cselim;
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      /* Simplified here: let loop_unroll() figure out any type instability. */
      if (ir->o == IR_TNEW) {
	return TREF_NIL;
      } else {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	if (tvispri(tv))
	  return TREF_PRI(itype2irt(tv));
	else if (tvisnum(tv))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (tvisint(tv))
	  return lj_ir_kint(J, intV(tv));
	else if (tvisgcv(tv))
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}